

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::dzeroequal(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  
  requireDStackDepth(this,2,"D0=");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::setTop(this_00,0,(&this->False)[uVar2 == 0 && uVar1 == 0]);
  return;
}

Assistant:

void dzeroequal(){
			REQUIRE_DSTACK_DEPTH(2, "D0=");
			DCell d1(dStack.getTop(1), dStack.getTop());
			auto result = d1.data_.SDcells==0;
			dStack.pop();
			dStack.setTop(0, result? True : False);
		}